

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wycheproof_util.cc
# Opt level: O1

UniquePtr<BIGNUM> GetWycheproofBIGNUM(FileTest *t,char *key,bool instruction)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  int in_ECX;
  undefined7 in_register_00000011;
  UniquePtr<BIGNUM> ret;
  UniquePtr<BIGNUM> tmp;
  BIGNUM *bn;
  string value;
  allocator<char> local_81;
  _Head_base<0UL,_bignum_st_*,_false> local_80;
  _Head_base<0UL,_bignum_st_*,_false> local_78;
  _Head_base<0UL,_bignum_st_*,_false> local_70;
  string local_68;
  string local_48;
  
  paVar1 = &local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if (in_ECX == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,(char *)CONCAT71(in_register_00000011,instruction),&local_81);
    bVar2 = FileTest::GetAttribute((FileTest *)key,&local_68,&local_48);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,(char *)CONCAT71(in_register_00000011,instruction),&local_81);
    bVar2 = FileTest::GetInstruction((FileTest *)key,&local_68,&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    local_70._M_head_impl = (bignum_st *)0x0;
    if (local_68._M_string_length < 0x80000000) {
      iVar3 = BN_hex2bn((BIGNUM **)&local_70,local_68._M_dataplus._M_p);
      if (iVar3 == (int)local_68._M_string_length) {
        local_80._M_head_impl = local_70._M_head_impl;
        if ((local_68._M_string_length == 0) || (0xf7 < (byte)(*local_68._M_dataplus._M_p - 0x38U)))
        {
LAB_0042c638:
          (t->reader_)._M_t.
          super___uniq_ptr_impl<FileTest::LineReader,_std::default_delete<FileTest::LineReader>_>.
          _M_t.
          super__Tuple_impl<0UL,_FileTest::LineReader_*,_std::default_delete<FileTest::LineReader>_>
          .super__Head_base<0UL,_FileTest::LineReader_*,_false>._M_head_impl =
               (LineReader *)local_80._M_head_impl;
          local_80._M_head_impl = (bignum_st *)0x0;
        }
        else {
          local_78._M_head_impl = (bignum_st *)BN_new();
          if (((BIGNUM *)local_78._M_head_impl != (BIGNUM *)0x0) &&
             (local_68._M_string_length < 0x20000000)) {
            iVar3 = BN_set_bit((BIGNUM *)local_78._M_head_impl,(int)local_68._M_string_length << 2);
            if (iVar3 != 0) {
              iVar3 = BN_sub((BIGNUM *)local_80._M_head_impl,(BIGNUM *)local_80._M_head_impl,
                             (BIGNUM *)local_78._M_head_impl);
              if (iVar3 != 0) {
                std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_78);
                goto LAB_0042c638;
              }
            }
          }
          (t->reader_)._M_t.
          super___uniq_ptr_impl<FileTest::LineReader,_std::default_delete<FileTest::LineReader>_>.
          _M_t.
          super__Tuple_impl<0UL,_FileTest::LineReader_*,_std::default_delete<FileTest::LineReader>_>
          .super__Head_base<0UL,_FileTest::LineReader_*,_false>._M_head_impl = (LineReader *)0x0;
          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_78);
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_80);
        goto LAB_0042c672;
      }
    }
    BN_free((BIGNUM *)local_70._M_head_impl);
    FileTest::PrintLine((FileTest *)key,"Could not decode value \'%s\'",local_68._M_dataplus._M_p);
  }
  (t->reader_)._M_t.
  super___uniq_ptr_impl<FileTest::LineReader,_std::default_delete<FileTest::LineReader>_>._M_t.
  super__Tuple_impl<0UL,_FileTest::LineReader_*,_std::default_delete<FileTest::LineReader>_>.
  super__Head_base<0UL,_FileTest::LineReader_*,_false>._M_head_impl = (LineReader *)0x0;
LAB_0042c672:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)t;
}

Assistant:

bssl::UniquePtr<BIGNUM> GetWycheproofBIGNUM(FileTest *t, const char *key,
                                            bool instruction) {
  std::string value;
  bool ok = instruction ? t->GetInstruction(&value, key)
                        : t->GetAttribute(&value, key);
  if (!ok) {
    return nullptr;
  }
  BIGNUM *bn = nullptr;
  if (value.size() > INT_MAX ||
      BN_hex2bn(&bn, value.c_str()) != static_cast<int>(value.size())) {
    BN_free(bn);
    t->PrintLine("Could not decode value '%s'", value.c_str());
    return nullptr;
  }
  bssl::UniquePtr<BIGNUM> ret(bn);
  if (!value.empty()) {
    // If the high bit is one, this is a negative number in Wycheproof.
    // Wycheproof's tests generally mimic Java APIs, including all their
    // mistakes. See
    // https://github.com/google/wycheproof/blob/0329f5b751ef102bd6b7b7181b6e049522a887f5/java/com/google/security/wycheproof/JsonUtil.java#L62.
    if ('0' > value[0] || value[0] > '7') {
      bssl::UniquePtr<BIGNUM> tmp(BN_new());
      if (!tmp ||  //
          value.size() > INT_MAX / 4 ||
          !BN_set_bit(tmp.get(), static_cast<int>(value.size() * 4)) ||
          !BN_sub(ret.get(), ret.get(), tmp.get())) {
        return nullptr;
      }
    }
  }
  return ret;
}